

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O0

void __thiscall
DebugAllocationTest_DeallocMismatch_Test::TestBody(DebugAllocationTest_DeallocMismatch_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  void *val;
  char *pcVar4;
  int *piVar5;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  char *regex_05;
  char *regex_06;
  char *regex_07;
  char *regex_08;
  AssertHelper local_480;
  Message local_478 [6];
  exception *gtest_exception_9;
  ReturnSentinel gtest_sentinel_9;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_9;
  pointer local_420;
  DeathTest *gtest_dt_9;
  Message local_410 [6];
  exception *gtest_exception_8;
  ReturnSentinel gtest_sentinel_8;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_8;
  pointer local_3b8;
  DeathTest *gtest_dt_8;
  int *y_3;
  int *x_4;
  Message local_398 [6];
  exception *gtest_exception_7;
  ReturnSentinel gtest_sentinel_7;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_7;
  pointer local_340;
  DeathTest *gtest_dt_7;
  Message local_330 [6];
  exception *gtest_exception_6;
  ReturnSentinel gtest_sentinel_6;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_6;
  pointer local_2d8;
  DeathTest *gtest_dt_6;
  int *y_2;
  int *x_3;
  Message local_2b8 [6];
  exception *gtest_exception_5;
  ReturnSentinel gtest_sentinel_5;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_5;
  pointer local_260;
  DeathTest *gtest_dt_5;
  Message local_250 [6];
  exception *gtest_exception_4;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_1f8;
  DeathTest *gtest_dt_4;
  int *y_1;
  int *x_2;
  Message local_1d8 [6];
  exception *gtest_exception_3;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_180;
  DeathTest *gtest_dt_3;
  Message local_170 [6];
  exception *gtest_exception_2;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_118;
  DeathTest *gtest_dt_2;
  int *y;
  int *x_1;
  Message local_f8 [6];
  exception *gtest_exception_1;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_a0;
  DeathTest *gtest_dt_1;
  Message local_90;
  int local_84;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  pointer local_20;
  DeathTest *gtest_dt;
  int *x;
  DebugAllocationTest_DeallocMismatch_Test *this_local;
  
  x = (int *)this;
  val = malloc(4);
  gtest_dt = (DeathTest *)noopt<void*>(val);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              (&local_38,(internal *)"mismatch.*being dealloc.*delete",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("delete x",&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x42,&local_20);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010e423;
    if (local_20 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_20);
      iVar2 = (*local_20->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_20->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_20->_vptr_DeathTest[4])(local_20,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010e3f1;
        local_84 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_20);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (gtest_dt != (DeathTest *)0x0)) {
            operator_delete(gtest_dt,4);
          }
          (*local_20->_vptr_DeathTest[5])(local_20,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_0010e3f1:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_84 != 0) goto LAB_0010e423;
    }
  }
  else {
LAB_0010e423:
    testing::Message::Message(&local_90);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x42,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_90);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"mismatch.*being dealloc.*delete *[[]",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x43,&local_a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010e84b;
    if (local_a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_a0);
      iVar2 = (*local_a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_a0->_vptr_DeathTest[4])(local_a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010e813;
        local_84 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1,local_a0);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (gtest_dt != (DeathTest *)0x0)) {
            operator_delete__(gtest_dt);
          }
          (*local_a0->_vptr_DeathTest[5])(local_a0,2);
          local_84 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_1);
        }
LAB_0010e813:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_84 != 0) goto LAB_0010e84b;
    }
  }
  else {
LAB_0010e84b:
    testing::Message::Message(local_f8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&x_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&x_1,local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x_1);
    testing::Message::~Message(local_f8);
  }
  free(gtest_dt);
  piVar5 = (int *)operator_new(4);
  y = noopt<int*>(piVar5);
  piVar5 = (int *)operator_new(4);
  gtest_dt_2 = (DeathTest *)noopt<int*>(piVar5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)"mismatch.*being dealloc.*free",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4c,&local_118);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010ec9d;
    if (local_118 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_118);
      iVar2 = (*local_118->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_118->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_118->_vptr_DeathTest[4])(local_118,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010ec65;
        local_84 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_2,local_118);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            free(y);
          }
          (*local_118->_vptr_DeathTest[5])(local_118,2);
          local_84 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_2);
        }
LAB_0010ec65:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_84 != 0) goto LAB_0010ec9d;
    }
  }
  else {
LAB_0010ec9d:
    testing::Message::Message(local_170);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_170);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)"mismatch.*being dealloc.*delete *[[]",regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x4d,&local_180);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010f0c8;
    if (local_180 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_180);
      iVar2 = (*local_180->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_180->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_180->_vptr_DeathTest[4])(local_180,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010f090;
        local_84 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_3,local_180);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (y != (int *)0x0)) {
            operator_delete__(y);
          }
          (*local_180->_vptr_DeathTest[5])(local_180,2);
          local_84 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_3);
        }
LAB_0010f090:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_84 != 0) goto LAB_0010f0c8;
    }
  }
  else {
LAB_0010f0c8:
    testing::Message::Message(local_1d8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&x_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x4d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&x_2,local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x_2);
    testing::Message::~Message(local_1d8);
  }
  if (y != (int *)0x0) {
    operator_delete(y,4);
  }
  operator_delete(gtest_dt_2,(nothrow_t *)&std::nothrow);
  piVar5 = (int *)operator_new__(4);
  y_1 = noopt<int*>(piVar5);
  piVar5 = (int *)operator_new__(4);
  gtest_dt_4 = (DeathTest *)noopt<int*>(piVar5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4,(internal *)"mismatch.*being dealloc.*free",regex_03);
    bVar1 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x56,&local_1f8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010f549;
    if (local_1f8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_4,local_1f8);
      iVar2 = (*local_1f8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1f8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1f8->_vptr_DeathTest[4])(local_1f8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010f511;
        local_84 = 10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_4,local_1f8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            free(y_1);
          }
          (*local_1f8->_vptr_DeathTest[5])(local_1f8,2);
          local_84 = 0xb;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_4);
        }
LAB_0010f511:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_4);
      if (local_84 != 0) goto LAB_0010f549;
    }
  }
  else {
LAB_0010f549:
    testing::Message::Message(local_250);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x56,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_5,local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_5);
    testing::Message::~Message(local_250);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5,(internal *)"mismatch.*being dealloc.*delete",regex_04);
    bVar1 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x57,&local_260);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010f979;
    if (local_260 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_5,local_260);
      iVar2 = (*local_260->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_260->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_260->_vptr_DeathTest[4])(local_260,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010f941;
        local_84 = 0xc;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_5,local_260);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (y_1 != (int *)0x0)) {
            operator_delete(y_1,4);
          }
          (*local_260->_vptr_DeathTest[5])(local_260,2);
          local_84 = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_5);
        }
LAB_0010f941:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_5);
      if (local_84 != 0) goto LAB_0010f979;
    }
  }
  else {
LAB_0010f979:
    testing::Message::Message(local_2b8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&x_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&x_3,local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x_3);
    testing::Message::~Message(local_2b8);
  }
  if (y_1 != (int *)0x0) {
    operator_delete__(y_1);
  }
  operator_delete__(gtest_dt_4,(nothrow_t *)&std::nothrow);
  piVar5 = (int *)operator_new(4,(nothrow_t *)&std::nothrow);
  y_2 = noopt<int*>(piVar5);
  piVar5 = (int *)operator_new(4,(nothrow_t *)&std::nothrow);
  gtest_dt_6 = (DeathTest *)noopt<int*>(piVar5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_6,(internal *)"mismatch.*being dealloc.*free",regex_05);
    bVar1 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x60,&local_2d8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_6);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010fe03;
    if (local_2d8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_6,local_2d8);
      iVar2 = (*local_2d8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_2d8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_2d8->_vptr_DeathTest[4])(local_2d8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010fdcb;
        local_84 = 0xe;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_6,local_2d8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            free(y_2);
          }
          (*local_2d8->_vptr_DeathTest[5])(local_2d8,2);
          local_84 = 0xf;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_6);
        }
LAB_0010fdcb:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_6);
      if (local_84 != 0) goto LAB_0010fe03;
    }
  }
  else {
LAB_0010fe03:
    testing::Message::Message(local_330);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x60,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_7,local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_7);
    testing::Message::~Message(local_330);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_7,(internal *)"mismatch.*being dealloc.*delete *[[]",regex_06);
    bVar1 = testing::internal::DeathTest::Create
                      ("delete [] x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x61,&local_340);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_7);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0011022e;
    if (local_340 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_7,local_340);
      iVar2 = (*local_340->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_340->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_340->_vptr_DeathTest[4])(local_340,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001101f6;
        local_84 = 0x10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_7,local_340);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (y_2 != (int *)0x0)) {
            operator_delete__(y_2);
          }
          (*local_340->_vptr_DeathTest[5])(local_340,2);
          local_84 = 0x11;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_7);
        }
LAB_001101f6:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_7);
      if (local_84 != 0) goto LAB_0011022e;
    }
  }
  else {
LAB_0011022e:
    testing::Message::Message(local_398);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&x_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&x_4,local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x_4);
    testing::Message::~Message(local_398);
  }
  if (y_2 != (int *)0x0) {
    operator_delete(y_2,4);
  }
  operator_delete(gtest_dt_6,(nothrow_t *)&std::nothrow);
  piVar5 = (int *)operator_new__(4,(nothrow_t *)&std::nothrow);
  y_3 = noopt<int*>(piVar5);
  piVar5 = (int *)operator_new__(4,(nothrow_t *)&std::nothrow);
  gtest_dt_8 = (DeathTest *)noopt<int*>(piVar5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_8,(internal *)"mismatch.*being dealloc.*free",regex_07);
    bVar1 = testing::internal::DeathTest::Create
                      ("free(x)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6a,&local_3b8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_8);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001106bd;
    if (local_3b8 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_8,local_3b8);
      iVar2 = (*local_3b8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_3b8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_3b8->_vptr_DeathTest[4])(local_3b8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00110685;
        local_84 = 0x12;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_8,local_3b8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            free(y_3);
          }
          (*local_3b8->_vptr_DeathTest[5])(local_3b8,2);
          local_84 = 0x13;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_8);
        }
LAB_00110685:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_8);
      if (local_84 != 0) goto LAB_001106bd;
    }
  }
  else {
LAB_001106bd:
    testing::Message::Message(local_410);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
               ,0x6a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_9,local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_9);
    testing::Message::~Message(local_410);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_9,(internal *)"mismatch.*being dealloc.*delete",regex_08);
    bVar1 = testing::internal::DeathTest::Create
                      ("delete x",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_9,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x6b,&local_420);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_420 == (pointer)0x0) goto LAB_00110b90;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_9,local_420);
      iVar2 = (*local_420->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_420->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_420->_vptr_DeathTest[4])(local_420,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00110ab5;
        local_84 = 0x14;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_9,local_420);
          bVar1 = testing::internal::AlwaysTrue();
          if ((bVar1) && (y_3 != (int *)0x0)) {
            operator_delete(y_3,4);
          }
          (*local_420->_vptr_DeathTest[5])(local_420,2);
          local_84 = 0x15;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_9);
        }
LAB_00110ab5:
        local_84 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_9);
      if (local_84 == 0) goto LAB_00110b90;
    }
  }
  testing::Message::Message(local_478);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_480,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
             ,0x6b,pcVar4);
  testing::internal::AssertHelper::operator=(&local_480,local_478);
  testing::internal::AssertHelper::~AssertHelper(&local_480);
  testing::Message::~Message(local_478);
LAB_00110b90:
  if (y_3 != (int *)0x0) {
    operator_delete__(y_3);
  }
  operator_delete__(gtest_dt_8,(nothrow_t *)&std::nothrow);
  return;
}

Assistant:

TEST(DebugAllocationTest, DeallocMismatch) {
  // malloc can be matched only by free
  // new can be matched only by delete and delete(nothrow)
  // new[] can be matched only by delete[] and delete[](nothrow)
  // new(nothrow) can be matched only by delete and delete(nothrow)
  // new(nothrow)[] can be matched only by delete[] and delete[](nothrow)

  // Allocate with malloc.
  {
    int* x = static_cast<int*>(noopt(malloc(sizeof(*x))));
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    // Should work fine.
    free(x);
  }

  // Allocate with new.
  {
    int* x = noopt(new int);
    int* y = noopt(new int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new[].
  {
    int* x = noopt(new int[1]);
    int* y = noopt(new int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }

  // Allocate with new(nothrow).
  {
    int* x = noopt(new (std::nothrow) int);
    int* y = noopt(new (std::nothrow) int);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete [] x, "mismatch.*being dealloc.*delete *[[]");
    delete x;
    ::operator delete(y, std::nothrow);
  }

  // Allocate with new(nothrow)[].
  {
    int* x = noopt(new (std::nothrow) int[1]);
    int* y = noopt(new (std::nothrow) int[1]);
    EXPECT_DEATH(free(x), "mismatch.*being dealloc.*free");
    EXPECT_DEATH(delete x, "mismatch.*being dealloc.*delete");
    delete [] x;
    ::operator delete[](y, std::nothrow);
  }
}